

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O0

MortonCode64 __thiscall Resorting::MortonCode64::operator+(MortonCode64 *this,MortonCode64 rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t result;
  uint64_t zSum;
  uint64_t ySum;
  uint64_t xSum;
  uint64_t zMask;
  uint64_t yMask;
  uint64_t code2;
  uint64_t code1;
  MortonCode64 *this_local;
  MortonCode64 rhs_local;
  
  uVar1 = this->data ^ 0x7000000000000000;
  uVar2 = rhs.data ^ 0x7000000000000000;
  uVar3 = xMask << 1;
  uVar4 = xMask << 2;
  MortonCode64(&rhs_local,
               ((uVar1 | xMask ^ 0xffffffffffffffffU) + (uVar2 & xMask) & xMask |
                (uVar1 | uVar3 ^ 0xffffffffffffffff) + (uVar2 & uVar3) & uVar3 |
               (uVar1 | uVar4 ^ 0xffffffffffffffff) + (uVar2 & uVar4) & uVar4) ^ 0x7000000000000000)
  ;
  return (MortonCode64)rhs_local.data;
}

Assistant:

MortonCode64 MortonCode64::operator+(const MortonCode64 rhs) const
{
    // invert sign bits
    uint64_t code1 = data ^ 0x7000000000000000;
    uint64_t code2 = rhs.data ^ 0x7000000000000000;

    uint64_t yMask = xMask << 1;
    uint64_t zMask = xMask << 2;

    uint64_t xSum = (code1 | ~xMask) + (code2 & xMask);
    uint64_t ySum = (code1 | ~yMask) + (code2 & yMask);
    uint64_t zSum = (code1 | ~zMask) + (code2 & zMask);

    uint64_t result = (xSum & xMask) | (ySum & yMask) | (zSum & zMask);
    return MortonCode64(result ^ 0x7000000000000000);
}